

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void decode(string *path)

{
  pointer pcVar1;
  long *plVar2;
  FILE *__stream;
  long *plVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  uchar *__ptr;
  int height;
  int width;
  uchar *occurences;
  int maximum;
  string newPath;
  uint local_b0;
  uint local_ac;
  uchar *local_a8;
  uchar *local_a0;
  int local_94;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_ac = 0;
  local_b0 = 0;
  local_94 = 0;
  pcVar1 = (path->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + path->_M_string_length);
  local_a8 = readEncoded(&local_70,&local_a0,(int *)&local_ac,(int *)&local_b0,&local_94);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  std::__cxx11::string::substr((ulong)local_50,(ulong)path);
  plVar2 = (long *)std::__cxx11::string::append((char *)local_50);
  local_90 = &local_80;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_80 = *plVar3;
    lStack_78 = plVar2[3];
  }
  else {
    local_80 = *plVar3;
    local_90 = (long *)*plVar2;
  }
  local_88 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  __stream = fopen((char *)local_90,"wb");
  iVar6 = 0;
  fprintf(__stream,"P6\n%d %d\n255\n",(ulong)local_ac,(ulong)local_b0);
  if (0 < (int)(local_b0 * local_ac)) {
    lVar5 = 0;
    do {
      if (local_a0[lVar5] != '\0') {
        __ptr = local_a8 + lVar5 * 3;
        uVar4 = 0;
        do {
          fwrite(__ptr,1,3,__stream);
          uVar4 = uVar4 + 1;
        } while (uVar4 < local_a0[lVar5]);
        iVar6 = iVar6 + uVar4;
      }
      lVar5 = lVar5 + 1;
    } while (iVar6 < (int)(local_b0 * local_ac));
  }
  fclose(__stream);
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  return;
}

Assistant:

void decode(std::string path)
{
    int width = 0;		// width of the image
    int height = 0;		// heigt of the image
    int maximum = 0;	// maximum pixel value

    unsigned char* occurences;
    unsigned char* encodedPixels = readEncoded(path, &occurences, width, height, maximum);

    string newPath = path.substr(0, path.size()-4) + "_decoded.ppm";
    FILE *fp = fopen(newPath.c_str(), "wb");
    fprintf(fp, "P6\n%d %d\n255\n", width, height);
    int pixelCounter = 0;
    for (int i = 0; i < width*height; )
    {
        for (int k = 0; k < occurences[pixelCounter]; k++)
        {
            fwrite(&encodedPixels[pixelCounter*3], 1, 3, fp);
            i++;        // we wrote one pixel
        }
        pixelCounter++;
    }
    fclose(fp);
}